

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::Serialize(AActor *this,FSerializer *arc)

{
  AActor *pAVar1;
  FSerializer *pFVar2;
  AActor *def;
  FSerializer *arc_local;
  AActor *this_local;
  
  pAVar1 = GetDefault(this);
  DObject::Serialize((DObject *)this,arc);
  pFVar2 = FSerializer::Sprite(arc,"sprite",&this->sprite,&pAVar1->sprite);
  pFVar2 = FSerializer::operator()(pFVar2,"pos",&this->__Pos,&pAVar1->__Pos);
  pFVar2 = FSerializer::operator()(pFVar2,"angles",&this->Angles,&pAVar1->Angles);
  pFVar2 = FSerializer::operator()(pFVar2,"frame",&this->frame,&pAVar1->frame);
  pFVar2 = FSerializer::operator()(pFVar2,"scale",&this->Scale,&pAVar1->Scale);
  pFVar2 = FSerializer::operator()(pFVar2,"renderstyle",&this->RenderStyle,&pAVar1->RenderStyle);
  pFVar2 = FSerializer::operator()(pFVar2,"renderflags",&this->renderflags,&pAVar1->renderflags);
  pFVar2 = FSerializer::operator()(pFVar2,"picnum",&this->picnum,&pAVar1->picnum);
  pFVar2 = FSerializer::operator()(pFVar2,"floorpic",&this->floorpic,&pAVar1->floorpic);
  pFVar2 = FSerializer::operator()(pFVar2,"ceilingpic",&this->ceilingpic,&pAVar1->ceilingpic);
  pFVar2 = FSerializer::operator()(pFVar2,"tidtohate",&this->TIDtoHate,&pAVar1->TIDtoHate);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"lastlookpn",&this->LastLookPlayerNumber,&pAVar1->LastLookPlayerNumber)
  ;
  pFVar2 = FSerializer::operator()(pFVar2,"lastlookactor",&this->LastLookActor);
  pFVar2 = FSerializer::operator()(pFVar2,"effects",&this->effects,&pAVar1->effects);
  pFVar2 = FSerializer::operator()(pFVar2,"alpha",&this->Alpha,&pAVar1->Alpha);
  pFVar2 = FSerializer::operator()(pFVar2,"fillcolor",&this->fillcolor,&pAVar1->fillcolor);
  pFVar2 = FSerializer::operator()(pFVar2,"sector",&this->Sector,&pAVar1->Sector);
  pFVar2 = FSerializer::operator()(pFVar2,"floorz",&this->floorz,&pAVar1->floorz);
  pFVar2 = FSerializer::operator()(pFVar2,"ceilingz",&this->ceilingz,&pAVar1->ceilingz);
  pFVar2 = FSerializer::operator()(pFVar2,"dropoffz",&this->dropoffz,&pAVar1->dropoffz);
  pFVar2 = FSerializer::operator()(pFVar2,"floorsector",&this->floorsector,&pAVar1->floorsector);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"ceilingsector",&this->ceilingsector,&pAVar1->ceilingsector);
  pFVar2 = FSerializer::operator()(pFVar2,"radius",&this->radius,&pAVar1->radius);
  pFVar2 = FSerializer::operator()(pFVar2,"renderradius",&this->renderradius,&pAVar1->renderradius);
  pFVar2 = FSerializer::operator()(pFVar2,"height",&this->Height,&pAVar1->Height);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"ppassheight",&this->projectilepassheight,&pAVar1->projectilepassheight
                     );
  pFVar2 = FSerializer::operator()(pFVar2,"vel",&this->Vel,&pAVar1->Vel);
  pFVar2 = FSerializer::operator()(pFVar2,"tics",&this->tics,&pAVar1->tics);
  pFVar2 = FSerializer::operator()(pFVar2,"state",&this->state,&pAVar1->state);
  pFVar2 = FSerializer::operator()(pFVar2,"damage",&this->DamageVal,&pAVar1->DamageVal);
  pFVar2 = FSerializer::Terrain(pFVar2,"floorterrain",&this->floorterrain,&pAVar1->floorterrain);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"projectilekickback",&this->projectileKickback,
                      &pAVar1->projectileKickback);
  pFVar2 = FSerializer::operator()(pFVar2,"flags",&this->flags,&pAVar1->flags);
  pFVar2 = FSerializer::operator()(pFVar2,"flags2",&this->flags2,&pAVar1->flags2);
  pFVar2 = FSerializer::operator()(pFVar2,"flags3",&this->flags3,&pAVar1->flags3);
  pFVar2 = FSerializer::operator()(pFVar2,"flags4",&this->flags4,&pAVar1->flags4);
  pFVar2 = FSerializer::operator()(pFVar2,"flags5",&this->flags5,&pAVar1->flags5);
  pFVar2 = FSerializer::operator()(pFVar2,"flags6",&this->flags6,&pAVar1->flags6);
  pFVar2 = FSerializer::operator()(pFVar2,"flags7",&this->flags7,&pAVar1->flags7);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"weaponspecial",&this->weaponspecial,&pAVar1->weaponspecial);
  pFVar2 = FSerializer::operator()(pFVar2,"special1",&this->special1,&pAVar1->special1);
  pFVar2 = FSerializer::operator()(pFVar2,"special2",&this->special2,&pAVar1->special2);
  pFVar2 = FSerializer::operator()(pFVar2,"specialf1",&this->specialf1,&pAVar1->specialf1);
  pFVar2 = FSerializer::operator()(pFVar2,"specialf2",&this->specialf2,&pAVar1->specialf2);
  pFVar2 = FSerializer::operator()(pFVar2,"health",&this->health,&pAVar1->health);
  pFVar2 = FSerializer::operator()(pFVar2,"movedir",&this->movedir,&pAVar1->movedir);
  pFVar2 = FSerializer::operator()(pFVar2,"visdir",&this->visdir,&pAVar1->visdir);
  pFVar2 = FSerializer::operator()(pFVar2,"movecount",&this->movecount,&pAVar1->movecount);
  pFVar2 = FSerializer::operator()(pFVar2,"strafecount",&this->strafecount,&pAVar1->strafecount);
  pFVar2 = FSerializer::operator()(pFVar2,"target",&this->target);
  pFVar2 = FSerializer::operator()(pFVar2,"lastenemy",&this->lastenemy);
  pFVar2 = FSerializer::operator()(pFVar2,"lastheard",&this->LastHeard);
  pFVar2 = FSerializer::operator()(pFVar2,"reactiontime",&this->reactiontime,&pAVar1->reactiontime);
  pFVar2 = FSerializer::operator()(pFVar2,"threshold",&this->threshold,&pAVar1->threshold);
  pFVar2 = FSerializer::operator()(pFVar2,"player",&this->player,&pAVar1->player);
  pFVar2 = FSerializer::operator()(pFVar2,"spawnpoint",&this->SpawnPoint,&pAVar1->SpawnPoint);
  pFVar2 = FSerializer::operator()(pFVar2,"spawnangle",&this->SpawnAngle,&pAVar1->SpawnAngle);
  pFVar2 = FSerializer::operator()(pFVar2,"starthealth",&this->StartHealth,&pAVar1->StartHealth);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"skillrespawncount",&this->skillrespawncount,&pAVar1->skillrespawncount
                     );
  pFVar2 = FSerializer::operator()(pFVar2,"tracer",&this->tracer);
  pFVar2 = FSerializer::operator()(pFVar2,"floorclip",&this->Floorclip,&pAVar1->Floorclip);
  pFVar2 = FSerializer::operator()(pFVar2,"tid",&this->tid,&pAVar1->tid);
  pFVar2 = FSerializer::operator()(pFVar2,"special",&this->special,&pAVar1->special);
  pFVar2 = FSerializer::Args(pFVar2,"args",this->args,pAVar1->args,this->special);
  pFVar2 = FSerializer::operator()(pFVar2,"accuracy",&this->accuracy,&pAVar1->accuracy);
  pFVar2 = FSerializer::operator()(pFVar2,"stamina",&this->stamina,&pAVar1->stamina);
  pFVar2 = FSerializer::operator()(pFVar2,"goal",&this->goal);
  pFVar2 = FSerializer::operator()(pFVar2,"waterlevel",&this->waterlevel,&pAVar1->waterlevel);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"minmissilechance",&this->MinMissileChance,&pAVar1->MinMissileChance);
  pFVar2 = FSerializer::operator()(pFVar2,"spawnflags",&this->SpawnFlags,&pAVar1->SpawnFlags);
  pFVar2 = FSerializer::operator()(pFVar2,"inventory",&this->Inventory);
  pFVar2 = FSerializer::operator()(pFVar2,"inventoryid",&this->InventoryID,&pAVar1->InventoryID);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"floatbobphase",&this->FloatBobPhase,&pAVar1->FloatBobPhase);
  pFVar2 = FSerializer::operator()(pFVar2,"translation",&this->Translation,&pAVar1->Translation);
  pFVar2 = FSerializer::operator()(pFVar2,"seesound",&this->SeeSound,&pAVar1->SeeSound);
  pFVar2 = FSerializer::operator()(pFVar2,"attacksound",&this->AttackSound,&pAVar1->AttackSound);
  pFVar2 = FSerializer::operator()(pFVar2,"paimsound",&this->PainSound,&pAVar1->PainSound);
  pFVar2 = FSerializer::operator()(pFVar2,"deathsound",&this->DeathSound,&pAVar1->DeathSound);
  pFVar2 = FSerializer::operator()(pFVar2,"activesound",&this->ActiveSound,&pAVar1->ActiveSound);
  pFVar2 = FSerializer::operator()(pFVar2,"usesound",&this->UseSound,&pAVar1->UseSound);
  pFVar2 = FSerializer::operator()(pFVar2,"bouncesound",&this->BounceSound,&pAVar1->BounceSound);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"wallbouncesound",&this->WallBounceSound,&pAVar1->WallBounceSound);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"crushpainsound",&this->CrushPainSound,&pAVar1->CrushPainSound);
  pFVar2 = FSerializer::operator()(pFVar2,"speed",&this->Speed,&pAVar1->Speed);
  pFVar2 = FSerializer::operator()(pFVar2,"floatspeed",&this->FloatSpeed,&pAVar1->FloatSpeed);
  pFVar2 = FSerializer::operator()(pFVar2,"mass",&this->Mass,&pAVar1->Mass);
  pFVar2 = FSerializer::operator()(pFVar2,"painchance",&this->PainChance,&pAVar1->PainChance);
  pFVar2 = FSerializer::operator()(pFVar2,"spawnstate",&this->SpawnState,&pAVar1->SpawnState);
  pFVar2 = FSerializer::operator()(pFVar2,"seestate",&this->SeeState,&pAVar1->SeeState);
  pFVar2 = FSerializer::operator()(pFVar2,"meleestate",&this->MeleeState,&pAVar1->MeleeState);
  pFVar2 = FSerializer::operator()(pFVar2,"missilestate",&this->MissileState,&pAVar1->MissileState);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"maxdropoffheight",&this->MaxDropOffHeight,&pAVar1->MaxDropOffHeight);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"maxstepheight",&this->MaxStepHeight,&pAVar1->MaxStepHeight);
  pFVar2 = FSerializer::operator()(pFVar2,"bounceflags",&this->BounceFlags,&pAVar1->BounceFlags);
  pFVar2 = FSerializer::operator()(pFVar2,"bouncefactor",&this->bouncefactor,&pAVar1->bouncefactor);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"wallbouncefactor",&this->wallbouncefactor,&pAVar1->wallbouncefactor);
  pFVar2 = FSerializer::operator()(pFVar2,"bouncecount",&this->bouncecount,&pAVar1->bouncecount);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"maxtargetrange",&this->maxtargetrange,&pAVar1->maxtargetrange);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"meleethreshold",&this->meleethreshold,&pAVar1->meleethreshold);
  pFVar2 = FSerializer::operator()(pFVar2,"meleerange",&this->meleerange,&pAVar1->meleerange);
  pFVar2 = FSerializer::operator()(pFVar2,"damagetype",&this->DamageType,&pAVar1->DamageType);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"damagetypereceived",&this->DamageTypeReceived,
                      &pAVar1->DamageTypeReceived);
  pFVar2 = FSerializer::operator()(pFVar2,"paintype",&this->PainType,&pAVar1->PainType);
  pFVar2 = FSerializer::operator()(pFVar2,"deathtype",&this->DeathType,&pAVar1->DeathType);
  pFVar2 = FSerializer::operator()(pFVar2,"gravity",&this->Gravity,&pAVar1->Gravity);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"fastchasestrafecount",&this->FastChaseStrafeCount,
                      &pAVar1->FastChaseStrafeCount);
  pFVar2 = FSerializer::operator()(pFVar2,"master",&this->master);
  pFVar2 = FSerializer::operator()(pFVar2,"smokecounter",&this->smokecounter,&pAVar1->smokecounter);
  pFVar2 = FSerializer::operator()(pFVar2,"blockingmobj",&this->BlockingMobj);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"blockingline",(line_t_conflict **)&this->BlockingLine,
                      (line_t_conflict **)&pAVar1->BlockingLine);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"visibletoteam",&this->VisibleToTeam,&pAVar1->VisibleToTeam);
  pFVar2 = FSerializer::operator()(pFVar2,"pushfactor",&this->pushfactor,&pAVar1->pushfactor);
  pFVar2 = FSerializer::operator()(pFVar2,"species",&this->Species,&pAVar1->Species);
  pFVar2 = FSerializer::operator()(pFVar2,"score",&this->Score,&pAVar1->Score);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"designatedteam",&this->DesignatedTeam,&pAVar1->DesignatedTeam);
  pFVar2 = FSerializer::operator()(pFVar2,"lastpush",&this->lastpush,&pAVar1->lastpush);
  pFVar2 = FSerializer::operator()(pFVar2,"lastbump",&this->lastbump,&pAVar1->lastbump);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"painthreshold",&this->PainThreshold,&pAVar1->PainThreshold);
  pFVar2 = FSerializer::operator()(pFVar2,"damagefactor",&this->DamageFactor,&pAVar1->DamageFactor);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"damagemultiply",&this->DamageMultiply,&pAVar1->DamageMultiply);
  pFVar2 = FSerializer::operator()(pFVar2,"waveindexxy",&this->WeaveIndexXY,&pAVar1->WeaveIndexXY);
  pFVar2 = FSerializer::operator()(pFVar2,"weaveindexz",&this->WeaveIndexZ,&pAVar1->WeaveIndexZ);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"pdmgreceived",&this->PoisonDamageReceived,
                      &pAVar1->PoisonDamageReceived);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"pdurreceived",&this->PoisonDurationReceived,
                      &pAVar1->PoisonDurationReceived);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"ppreceived",&this->PoisonPeriodReceived,&pAVar1->PoisonPeriodReceived)
  ;
  pFVar2 = FSerializer::operator()(pFVar2,"poisoner",&this->Poisoner);
  pFVar2 = FSerializer::operator()(pFVar2,"posiondamage",&this->PoisonDamage,&pAVar1->PoisonDamage);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"poisonduration",&this->PoisonDuration,&pAVar1->PoisonDuration);
  pFVar2 = FSerializer::operator()(pFVar2,"poisonperiod",&this->PoisonPeriod,&pAVar1->PoisonPeriod);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"poisondamagetype",&this->PoisonDamageType,&pAVar1->PoisonDamageType);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"poisondmgtypereceived",&this->PoisonDamageTypeReceived,
                      &pAVar1->PoisonDamageTypeReceived);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"conversationroot",&this->ConversationRoot,&pAVar1->ConversationRoot);
  pFVar2 = FSerializer::operator()(pFVar2,"conversation",&this->Conversation,&pAVar1->Conversation);
  pFVar2 = FSerializer::operator()(pFVar2,"friendplayer",&this->FriendPlayer,&pAVar1->FriendPlayer);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"telefogsourcetype",&this->TeleFogSourceType,&pAVar1->TeleFogSourceType
                     );
  pFVar2 = FSerializer::operator()
                     (pFVar2,"telefogdesttype",&this->TeleFogDestType,&pAVar1->TeleFogDestType);
  pFVar2 = FSerializer::operator()(pFVar2,"ripperlevel",&this->RipperLevel,&pAVar1->RipperLevel);
  pFVar2 = FSerializer::operator()(pFVar2,"riplevelmin",&this->RipLevelMin,&pAVar1->RipLevelMin);
  pFVar2 = FSerializer::operator()(pFVar2,"riplevelmax",&this->RipLevelMax,&pAVar1->RipLevelMax);
  pFVar2 = FSerializer::operator()(pFVar2,"devthreshold",&this->DefThreshold,&pAVar1->DefThreshold);
  pFVar2 = FSerializer::operator()(pFVar2,"spriteangle",&this->SpriteAngle,&pAVar1->SpriteAngle);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"spriterotation",&this->SpriteRotation,&pAVar1->SpriteRotation);
  pFVar2 = FSerializer::operator()(pFVar2,"alternative",&this->alternative);
  pFVar2 = FSerializer::operator()(pFVar2,"tag",&this->Tag,&pAVar1->Tag);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"visiblestartangle",&this->VisibleStartAngle,&pAVar1->VisibleStartAngle
                     );
  pFVar2 = FSerializer::operator()
                     (pFVar2,"visibleendangle",&this->VisibleEndAngle,&pAVar1->VisibleEndAngle);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"visiblestartpitch",&this->VisibleStartPitch,&pAVar1->VisibleStartPitch
                     );
  FSerializer::operator()(pFVar2,"visibleendpitch",&this->VisibleEndPitch,&pAVar1->VisibleEndPitch);
  return;
}

Assistant:

void AActor::Serialize(FSerializer &arc)
{
	AActor *def = GetDefault();

	Super::Serialize(arc);

	arc
		.Sprite("sprite", sprite, &def->sprite)
		A("pos", __Pos)
		A("angles", Angles)
		A("frame", frame)
		A("scale", Scale)
		A("renderstyle", RenderStyle)
		A("renderflags", renderflags)
		A("picnum", picnum)
		A("floorpic", floorpic)
		A("ceilingpic", ceilingpic)
		A("tidtohate", TIDtoHate)
		A("lastlookpn", LastLookPlayerNumber)
		("lastlookactor", LastLookActor)
		A("effects", effects)
		A("alpha", Alpha)
		A("fillcolor", fillcolor)
		A("sector", Sector)
		A("floorz", floorz)
		A("ceilingz", ceilingz)
		A("dropoffz", dropoffz)
		A("floorsector", floorsector)
		A("ceilingsector", ceilingsector)
		A("radius", radius)
		A("renderradius", renderradius)
		A("height", Height)
		A("ppassheight", projectilepassheight)
		A("vel", Vel)
		A("tics", tics)
		A("state", state)
		A("damage", DamageVal)
		.Terrain("floorterrain", floorterrain, &def->floorterrain)
		A("projectilekickback", projectileKickback)
		A("flags", flags)
		A("flags2", flags2)
		A("flags3", flags3)
		A("flags4", flags4)
		A("flags5", flags5)
		A("flags6", flags6)
		A("flags7", flags7)
		A("weaponspecial", weaponspecial)
		A("special1", special1)
		A("special2", special2)
		A("specialf1", specialf1)
		A("specialf2", specialf2)
		A("health", health)
		A("movedir", movedir)
		A("visdir", visdir)
		A("movecount", movecount)
		A("strafecount", strafecount)
		("target", target)
		("lastenemy", lastenemy)
		("lastheard", LastHeard)
		A("reactiontime", reactiontime)
		A("threshold", threshold)
		A("player", player)
		A("spawnpoint", SpawnPoint)
		A("spawnangle", SpawnAngle)
		A("starthealth", StartHealth)
		A("skillrespawncount", skillrespawncount)
		("tracer", tracer)
		A("floorclip", Floorclip)
		A("tid", tid)
		A("special", special)
		.Args("args", args, def->args, special)
		A("accuracy", accuracy)
		A("stamina", stamina)
		("goal", goal)
		A("waterlevel", waterlevel)
		A("minmissilechance", MinMissileChance)
		A("spawnflags", SpawnFlags)
		("inventory", Inventory)
		A("inventoryid", InventoryID)
		A("floatbobphase", FloatBobPhase)
		A("translation", Translation)
		A("seesound", SeeSound)
		A("attacksound", AttackSound)
		A("paimsound", PainSound)
		A("deathsound", DeathSound)
		A("activesound", ActiveSound)
		A("usesound", UseSound)
		A("bouncesound", BounceSound)
		A("wallbouncesound", WallBounceSound)
		A("crushpainsound", CrushPainSound)
		A("speed", Speed)
		A("floatspeed", FloatSpeed)
		A("mass", Mass)
		A("painchance", PainChance)
		A("spawnstate", SpawnState)
		A("seestate", SeeState)
		A("meleestate", MeleeState)
		A("missilestate", MissileState)
		A("maxdropoffheight", MaxDropOffHeight)
		A("maxstepheight", MaxStepHeight)
		A("bounceflags", BounceFlags)
		A("bouncefactor", bouncefactor)
		A("wallbouncefactor", wallbouncefactor)
		A("bouncecount", bouncecount)
		A("maxtargetrange", maxtargetrange)
		A("meleethreshold", meleethreshold)
		A("meleerange", meleerange)
		A("damagetype", DamageType)
		A("damagetypereceived", DamageTypeReceived)
		A("paintype", PainType)
		A("deathtype", DeathType)
		A("gravity", Gravity)
		A("fastchasestrafecount", FastChaseStrafeCount)
		("master", master)
		A("smokecounter", smokecounter)
		("blockingmobj", BlockingMobj)
		A("blockingline", BlockingLine)
		A("visibletoteam", VisibleToTeam)
		A("pushfactor", pushfactor)
		A("species", Species)
		A("score", Score)
		A("designatedteam", DesignatedTeam)
		A("lastpush", lastpush)
		A("lastbump", lastbump)
		A("painthreshold", PainThreshold)
		A("damagefactor", DamageFactor)
		A("damagemultiply", DamageMultiply)
		A("waveindexxy", WeaveIndexXY)
		A("weaveindexz", WeaveIndexZ)
		A("pdmgreceived", PoisonDamageReceived)
		A("pdurreceived", PoisonDurationReceived)
		A("ppreceived", PoisonPeriodReceived)
		("poisoner", Poisoner)
		A("posiondamage", PoisonDamage)
		A("poisonduration", PoisonDuration)
		A("poisonperiod", PoisonPeriod)
		A("poisondamagetype", PoisonDamageType)
		A("poisondmgtypereceived", PoisonDamageTypeReceived)
		A("conversationroot", ConversationRoot)
		A("conversation", Conversation)
		A("friendplayer", FriendPlayer)
		A("telefogsourcetype", TeleFogSourceType)
		A("telefogdesttype", TeleFogDestType)
		A("ripperlevel", RipperLevel)
		A("riplevelmin", RipLevelMin)
		A("riplevelmax", RipLevelMax)
		A("devthreshold", DefThreshold)
		A("spriteangle", SpriteAngle)
		A("spriterotation", SpriteRotation)
		("alternative", alternative)
		A("tag", Tag)
		A("visiblestartangle",VisibleStartAngle)
		A("visibleendangle",VisibleEndAngle)
		A("visiblestartpitch",VisibleStartPitch)
		A("visibleendpitch",VisibleEndPitch);
}